

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler fatalConditionHandler;
  FatalConditionHandler *in_stack_ffffffffffffffe0;
  
  FatalConditionHandler::FatalConditionHandler(in_stack_ffffffffffffffe0);
  TestCase::invoke((TestCase *)0x1b1f09);
  FatalConditionHandler::reset(in_stack_ffffffffffffffe0);
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)0x1b1f21);
  return;
}

Assistant:

void invokeActiveTestCase() {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            m_activeTestCase->invoke();
            fatalConditionHandler.reset();
        }